

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarness.cpp
# Opt level: O0

void usage(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cout,
                         "\nUsage:\n    XSTSHarness <testSet>\n\nThis program runs the tests listed in the XMLSchema Test Suite, available at\nhttp://www.w3.org/XML/2004/xml-schema-test-suite/xmlschema2006-11-06/xsts-2007-06-20.tar.gz\nRun this executable against the suite.xml file found in the top directory\n\nIt also runs the tests listed in the XML Test Suite, available at\nhttp://www.w3.org/XML/Test/xmlts20080827.zip\nRun this executable against the xmlconf.xml file found in the top directory\n\n"
                        );
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void usage()
{
    std::cout <<
            "\n"
            "Usage:\n"
            "    XSTSHarness <testSet>\n"
            "\n"
            "This program runs the tests listed in the XMLSchema Test Suite, available at\n"
            "http://www.w3.org/XML/2004/xml-schema-test-suite/xmlschema2006-11-06/xsts-2007-06-20.tar.gz\n"
            "Run this executable against the suite.xml file found in the top directory\n"
            "\n"
            "It also runs the tests listed in the XML Test Suite, available at\n"
            "http://www.w3.org/XML/Test/xmlts20080827.zip\n"
            "Run this executable against the xmlconf.xml file found in the top directory\n"
            "\n"
         << std::endl;
}